

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

void Bac_PtrFree(Vec_Ptr_t *vDes)

{
  int iVar1;
  Vec_Ptr_t *vNtk_00;
  undefined4 local_1c;
  int i;
  Vec_Ptr_t *vNtk;
  Vec_Ptr_t *vDes_local;
  
  if (vDes != (Vec_Ptr_t *)0x0) {
    for (local_1c = 1; iVar1 = Vec_PtrSize(vDes), local_1c < iVar1; local_1c = local_1c + 1) {
      vNtk_00 = (Vec_Ptr_t *)Vec_PtrEntry(vDes,local_1c);
      Bac_PtrFreeNtk(vNtk_00);
    }
    Vec_PtrFree(vDes);
  }
  return;
}

Assistant:

void Bac_PtrFree( Vec_Ptr_t * vDes )
{
    Vec_Ptr_t * vNtk; int i;
    if ( !vDes ) return;
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        Bac_PtrFreeNtk( vNtk );
    Vec_PtrFree( vDes );
}